

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.h
# Opt level: O0

float __thiscall embree::Statistics::getSigma(Statistics *this)

{
  double *in_RDI;
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double local_40;
  float local_24;
  
  if (in_RDI[3] == 0.0) {
    local_24 = 0.0;
  }
  else {
    dVar1 = in_RDI[3];
    auVar3._8_4_ = (int)((ulong)dVar1 >> 0x20);
    auVar3._0_8_ = dVar1;
    auVar3._12_4_ = 0x45300000;
    dVar2 = (auVar3._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,SUB84(dVar1,0)) - 4503599627370496.0);
    dVar1 = *in_RDI / dVar2;
    local_40 = in_RDI[1] / dVar2 - dVar1 * dVar1;
    if (local_40 <= 0.0) {
      local_40 = 0.0;
    }
    dVar1 = sqrt(local_40);
    local_24 = (float)dVar1;
  }
  return local_24;
}

Assistant:

float getSigma() const 
    {
      if (N == 0) return 0.0f;
      else return (float) sqrt(max(0.0,v2/N - sqr(v/N)));
    }